

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_CommandLineTestRunner_realTeamCityOutputShouldBeCreatedAndWorkProperly_TestShell::createTest
          (TEST_CommandLineTestRunner_realTeamCityOutputShouldBeCreatedAndWorkProperly_TestShell
           *this)

{
  TEST_CommandLineTestRunner_realTeamCityOutputShouldBeCreatedAndWorkProperly_Test *this_00;
  TEST_CommandLineTestRunner_realTeamCityOutputShouldBeCreatedAndWorkProperly_TestShell *this_local;
  
  this_00 = (TEST_CommandLineTestRunner_realTeamCityOutputShouldBeCreatedAndWorkProperly_Test *)
            operator_new(0x58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
                         ,0x17f);
  TEST_CommandLineTestRunner_realTeamCityOutputShouldBeCreatedAndWorkProperly_Test::
  TEST_CommandLineTestRunner_realTeamCityOutputShouldBeCreatedAndWorkProperly_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(CommandLineTestRunner, realTeamCityOutputShouldBeCreatedAndWorkProperly)
{
    const char* argv[] = { "tests.exe", "-oteamcity", "-v", "-kpackage", };

    FakeOutput fakeOutput; /* UT_PTR_SET() is not reentrant */

    CommandLineTestRunner commandLineTestRunner(4, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    fakeOutput.restoreOriginals();

    STRCMP_CONTAINS("##teamcity[testSuiteStarted name='group1'", fakeOutput.console.asCharString());
    STRCMP_CONTAINS("##teamcity[testStarted name='test1'", fakeOutput.console.asCharString());
    STRCMP_CONTAINS("##teamcity[testFinished name='test1'", fakeOutput.console.asCharString());
    STRCMP_CONTAINS("##teamcity[testSuiteFinished name='group1'", fakeOutput.console.asCharString());
}